

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

Side * __thiscall Application::convert(Side *__return_storage_ptr__,Application *this,Side side)

{
  logic_error *this_00;
  CHAR *value;
  
  if (side == buy) {
    value = "12211Application";
  }
  else {
    if (side != sell) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Unsupported Side, use buy or sell");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    value = "2211Application";
  }
  FIX::Side::Side(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

FIX::Side Application::convert(Order::Side side) {
  switch (side) {
  case Order::buy:
    return FIX::Side(FIX::Side_BUY);
  case Order::sell:
    return FIX::Side(FIX::Side_SELL);
  default:
    throw std::logic_error("Unsupported Side, use buy or sell");
  }
}